

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tilemap.cpp
# Opt level: O1

void __thiscall imgtogb::Tilemap::Tilemap(Tilemap *this,Image *img,int offset)

{
  ulong uVar1;
  _Rb_tree_header *p_Var2;
  uchar uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  _Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_> _Var7;
  size_type sVar8;
  size_type sVar9;
  reference piVar10;
  uint uVar11;
  uint uVar12;
  uchar *puVar13;
  ulong uVar14;
  long lVar15;
  _Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_> _Var16;
  long lVar17;
  uchar *puVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uchar *puVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_>,_std::_Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_>_>
  pVar29;
  int hash;
  int local_c4;
  uchar *local_c0;
  _Rb_tree<int,std::pair<int_const,imgtogb::Tile>,std::_Select1st<std::pair<int_const,imgtogb::Tile>>,std::less<int>,std::allocator<std::pair<int_const,imgtogb::Tile>>>
  *local_b8;
  ulong local_b0;
  unbounded_array<int,_std::allocator<int>_> *local_a8;
  Tilemap *local_a0;
  ulong local_98;
  Image *local_90;
  size_type local_88;
  ulong local_80;
  ulong local_78;
  size_t local_70;
  long local_68;
  uchar *local_60;
  uchar *local_58;
  pair<int,_imgtogb::Tile> local_50;
  
  this->img = img;
  this->offset = offset;
  uVar4 = img->_width;
  uVar11 = uVar4 + 7;
  if (-1 < (int)uVar4) {
    uVar11 = uVar4;
  }
  this->tiles_x = (long)((int)uVar11 >> 3);
  uVar4 = img->_height;
  uVar12 = uVar4 + 7;
  if (-1 < (int)uVar4) {
    uVar12 = uVar4;
  }
  this->tiles_y = (long)((int)uVar12 >> 3);
  this->ntiles = 0;
  local_90 = img;
  boost::numeric::ublas::
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  ::matrix(&this->tilemap,(long)((int)uVar11 >> 3),(long)((int)uVar12 >> 3));
  p_Var2 = &(this->map)._M_t._M_impl.super__Rb_tree_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (this->tiles_y != 0) {
    local_b8 = (_Rb_tree<int,std::pair<int_const,imgtogb::Tile>,std::_Select1st<std::pair<int_const,imgtogb::Tile>>,std::less<int>,std::allocator<std::pair<int_const,imgtogb::Tile>>>
                *)&this->map;
    local_a8 = &(this->tilemap).data_;
    local_b0 = 0;
    uVar25 = 0;
    local_a0 = this;
    do {
      if (this->tiles_x != 0) {
        uVar4 = (uint)(local_b0 >> 3) & 0x1fffffff;
        uVar26 = (ulong)(uint)((int)uVar25 * 8);
        local_80 = (ulong)(uVar4 * 8);
        local_78 = (ulong)(uVar4 << 3);
        lVar17 = 0;
        uVar19 = 0;
        local_98 = uVar25;
        do {
          local_c0 = (uchar *)(ulong)((uint)lVar17 & 0xfffffff8);
          local_70 = this->ntiles;
          puVar13 = local_c0 + local_78 * local_90->_width + (long)local_90->_data;
          lVar15 = 0;
          local_c4 = 0;
          do {
            lVar20 = 0;
            do {
              local_c4 = local_c4 + (uint)puVar13[lVar20];
              lVar20 = lVar20 + 1;
            } while (lVar20 != 8);
            lVar15 = lVar15 + 1;
            puVar13 = puVar13 + local_90->_width;
          } while (lVar15 != 8);
          pVar29 = std::
                   _Rb_tree<int,_std::pair<const_int,_imgtogb::Tile>,_std::_Select1st<std::pair<const_int,_imgtogb::Tile>_>,_std::less<int>,_std::allocator<std::pair<const_int,_imgtogb::Tile>_>_>
                   ::equal_range((_Rb_tree<int,_std::pair<const_int,_imgtogb::Tile>,_std::_Select1st<std::pair<const_int,_imgtogb::Tile>_>,_std::less<int>,_std::allocator<std::pair<const_int,_imgtogb::Tile>_>_>
                                  *)local_b8,&local_c4);
          bVar28 = pVar29.first._M_node._M_node != pVar29.second._M_node._M_node;
          local_88 = uVar19;
          local_68 = lVar17;
          if (bVar28) {
            puVar13 = local_90->_data;
            uVar25 = (ulong)local_90->_width;
            uVar3 = puVar13[uVar26 * uVar25 + (ulong)(uint)((int)uVar19 * 8)];
            local_58 = puVar13 + 1;
            local_60 = local_c0 + local_80 * uVar25 + (long)puVar13 + 1;
            bVar28 = true;
            local_c0 = puVar13;
            do {
              _Var16 = pVar29.second._M_node;
              _Var7 = pVar29.first._M_node;
              uVar21 = (ulong)(uint)(*(int *)&_Var7._M_node[1]._M_parent << 3);
              uVar14 = (ulong)(uint)(*(int *)&_Var7._M_node[1]._M_left << 3);
              lVar17 = uVar14 * uVar25;
              if (uVar3 == local_c0[uVar21 + lVar17]) {
                puVar18 = local_58 + lVar17 + uVar21;
                bVar27 = false;
                puVar22 = local_60;
                uVar23 = 0;
                do {
                  uVar24 = 0xffffffffffffffff;
                  do {
                    if (uVar24 == 6) goto LAB_00143a09;
                    lVar17 = uVar24 + 1;
                    uVar1 = uVar24 + 1;
                    lVar15 = uVar24 + 1;
                    uVar24 = uVar1;
                  } while (puVar22[lVar17] == puVar18[lVar15]);
                  if (uVar1 < 7) break;
LAB_00143a09:
                  uVar24 = uVar23 + 1;
                  bVar27 = 6 < uVar23;
                  if (uVar24 == 8) break;
                  puVar22 = puVar22 + uVar25;
                  puVar18 = puVar18 + uVar25;
                  uVar23 = uVar24;
                } while (puVar13[(uVar24 + uVar26) * uVar25 + (ulong)(uint)((int)uVar19 * 8)] ==
                         local_c0[(uVar24 + uVar14) * uVar25 + uVar21]);
                if (bVar27) {
                  iVar5 = *(int *)&_Var7._M_node[1]._M_right;
                  sVar8 = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                                    (local_88,(local_a0->tilemap).size1_,local_98,
                                     (local_a0->tilemap).size2_);
                  piVar10 = boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>::
                            operator[](local_a8,sVar8);
                  *piVar10 = iVar5;
                  break;
                }
              }
              _Var7._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var7._M_node);
              pVar29.second._M_node = _Var16._M_node;
              pVar29.first._M_node = _Var7._M_node;
              bVar28 = _Var7._M_node != _Var16._M_node;
            } while (bVar28);
          }
          sVar8 = local_88;
          uVar25 = local_98;
          this = local_a0;
          if (!bVar28) {
            local_50.first = local_c4;
            local_50.second.x = local_88;
            local_50.second.y = local_98;
            local_50.second.id = (int)local_70;
            std::
            _Rb_tree<int,std::pair<int_const,imgtogb::Tile>,std::_Select1st<std::pair<int_const,imgtogb::Tile>>,std::less<int>,std::allocator<std::pair<int_const,imgtogb::Tile>>>
            ::_M_emplace_equal<std::pair<int,imgtogb::Tile>>(local_b8,&local_50);
            sVar6 = this->ntiles;
            sVar9 = (this->tilemap).size1_;
            this->ntiles = sVar6 + 1;
            sVar9 = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                              (sVar8,sVar9,uVar25,(this->tilemap).size2_);
            piVar10 = boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>::operator[]
                                (local_a8,sVar9);
            *piVar10 = (int)sVar6;
          }
          uVar19 = sVar8 + 1;
          lVar17 = local_68 + 8;
        } while (uVar19 < this->tiles_x);
      }
      uVar25 = uVar25 + 1;
      local_b0 = local_b0 + 8;
    } while (uVar25 < this->tiles_y);
  }
  return;
}

Assistant:

Tilemap::Tilemap(
		const Image &img,
		int offset
	)
	: img(&img)
	, offset(offset)
	, tiles_x(img.width() / 8)
	, tiles_y(img.height() / 8)
	, ntiles(0)
	, tilemap(tiles_x, tiles_y)
	{
		for(size_t iy = 0; iy < tiles_y; ++iy) {
			for(size_t ix = 0; ix < tiles_x; ++ix) {
				Tile tile(ix, iy, ntiles);
				int hash = tile_hash(tile, img);

				// Look for existing tiles with same hash
				mmap_range range = map.equal_range(hash);
				bool found = range.first != range.second;

				if(found) {
					found = false;
					for(mmap::iterator it = range.first; it != range.second; ++it) {
						if(compare(tile, it->second, img) == true) {
							found = true;
							tilemap(ix, iy) = it->second.id;
							break;
						}
					}
				}

				// Add new tile if not found
				if(!found) {
					map.insert(std::pair<int,Tile>(hash, tile));
					tilemap(ix, iy) = ntiles++;
				}
			}
		}
	}